

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi__uint16 *
stbi__load_and_postprocess_16bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi__context *in_RCX;
  int in_EDI;
  stbi__uint32 in_R8D;
  long *in_FS_OFFSET;
  int channels;
  void *result;
  stbi__result_info ri;
  int in_stack_000007c4;
  int in_stack_000007c8;
  int in_stack_000007cc;
  void *in_stack_000007d0;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  stbi__uint16 *local_8;
  
  local_8 = (stbi__uint16 *)
            stbi__load_main(in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                            (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                            (stbi__result_info *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_EDI);
  if (local_8 == (stbi__uint16 *)0x0) {
    local_8 = (stbi__uint16 *)0x0;
  }
  else {
    if (in_stack_ffffffffffffffc8 != 0x10) {
      if (in_R8D == 0) {
        in_R8D = in_RCX->img_x;
      }
      local_8 = stbi__convert_8_to_16
                          ((stbi_uc *)local_8,in_R8D,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff9c);
    }
    iVar1 = stbi__vertically_flip_on_load_global;
    if (*(int *)(*in_FS_OFFSET + -0x5c) != 0) {
      iVar1 = *(int *)(*in_FS_OFFSET + -0x60);
    }
    if (iVar1 != 0) {
      stbi__vertical_flip(in_stack_000007d0,in_stack_000007cc,in_stack_000007c8,in_stack_000007c4);
    }
  }
  return local_8;
}

Assistant:

static stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 16);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 16) {
      result = stbi__convert_8_to_16((stbi_uc *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 16;
   }

   // @TODO: move stbi__convert_format16 to here
   // @TODO: special case RGB-to-Y (and RGBA-to-YA) for 8-bit-to-16-bit case to keep more precision

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi__uint16));
   }

   return (stbi__uint16 *) result;
}